

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O3

void __thiscall
ONX_ModelComponentIterator::Internal_SetLink
          (ONX_ModelComponentIterator *this,ONX_ModelComponentReferenceLink *link)

{
  ON__UINT64 OVar1;
  
  this->m_model_content_version = this->m_model->m_private->m_model_content_version_number;
  this->m_link = link;
  if (link != (ONX_ModelComponentReferenceLink *)0x0) {
    this->m_current_component_sn = link->m_sn;
    if (link->m_next == (ONX_ModelComponentReferenceLink *)0x0) {
      OVar1 = 0;
    }
    else {
      OVar1 = link->m_next->m_sn;
    }
    this->m_next_component_sn = OVar1;
    if (link->m_prev == (ONX_ModelComponentReferenceLink *)0x0) {
      OVar1 = 0;
    }
    else {
      OVar1 = link->m_prev->m_sn;
    }
    this->m_prev_component_sn = OVar1;
    ON_ModelComponentWeakReference::operator=(&this->m_current_component_weak_ref,&link->m_mcr);
    return;
  }
  this->m_current_component_sn = 0;
  this->m_next_component_sn = 0;
  this->m_prev_component_sn = 0;
  ON_ModelComponentWeakReference::operator=
            (&this->m_current_component_weak_ref,&ON_ModelComponentWeakReference::Empty);
  this->m_model_content_version = 0;
  return;
}

Assistant:

void ONX_ModelComponentIterator::Internal_SetLink(
  const class ONX_ModelComponentReferenceLink* link
  ) const
{
  // m_model is never nullptr when this function is called
  m_model_content_version = m_model->ModelContentVersionNumber();
  m_link = link;
  if (nullptr == m_link)
  {
    m_current_component_sn = 0;
    m_next_component_sn = 0;
    m_prev_component_sn = 0;
    m_current_component_weak_ref = ON_ModelComponentWeakReference::Empty;
    m_model_content_version = 0;
  }
  else
  {
    m_current_component_sn = link->m_sn;
    m_next_component_sn = (nullptr != link->m_next) ? link->m_next->m_sn : 0;
    m_prev_component_sn = (nullptr != link->m_prev) ? link->m_prev->m_sn : 0;
    m_current_component_weak_ref = link->m_mcr;
  }
}